

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

LazyObject * __thiscall Assimp::STEP::DB::MustGetObject(DB *this,uint64_t id)

{
  LazyObject *pLVar1;
  TypeError *this_00;
  string local_40;
  
  pLVar1 = GetObject(this,id);
  if (pLVar1 != (LazyObject *)0x0) {
    return pLVar1;
  }
  this_00 = (TypeError *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"requested entity is not present","");
  TypeError::TypeError(this_00,&local_40,id,0xffffffffffffffff);
  __cxa_throw(this_00,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const LazyObject& MustGetObject(uint64_t id) const {
            const LazyObject* o = GetObject(id);
            if (!o) {
                throw TypeError("requested entity is not present",id);
            }
            return *o;
        }